

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O2

void __thiscall
IRBuilderAsmJs::BuildAsmTypedArr
          (IRBuilderAsmJs *this,OpCodeAsmJs newOpcode,uint32 offset,uint32 slotIndex,RegSlot value,
          ViewType viewType)

{
  code *pcVar1;
  bool bVar2;
  anon_union_2_4_ea848c7b_for_ValueType_13 valueType;
  RegSlot srcRegSlot;
  uint uVar3;
  RegSlot srcRegSlot_00;
  RegOpnd *pRVar4;
  RegOpnd *pRVar5;
  IntConstOpnd *src2Opnd;
  Instr *pIVar6;
  IndirOpnd *dstOpnd;
  undefined4 *puVar7;
  IndirOpnd *this_00;
  JITTimeFunctionBody *this_01;
  IndirOpnd *src1Opnd;
  undefined6 in_register_00000032;
  OpCode opcode;
  OpCodeAsmJs OVar8;
  MemAccessTypeInfo local_38;
  MemAccessTypeInfo typeInfo;
  
  ValueType::ValueType(&local_38.arrayType);
  InitializeMemAccessTypeInfo(viewType,&local_38);
  srcRegSlot = GetRegSlotFromTypedReg(this,value,local_38.valueRegType);
  uVar3 = (uint)CONCAT62(in_register_00000032,newOpcode) & 0xfffffffd;
  if ((short)uVar3 == 0x5d) {
LAB_004b9e7d:
    pRVar4 = BuildSrcOpnd(this,4,TyVar);
    dstOpnd = IR::IndirOpnd::New(pRVar4,slotIndex,local_38.type,this->m_func,false);
  }
  else {
    if (uVar3 != 0x5c) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                         ,0x663,
                         "(newOpcode == Js::OpCodeAsmJs::LdArrConst || newOpcode == Js::OpCodeAsmJs::StArrConst)"
                         ,
                         "newOpcode == Js::OpCodeAsmJs::LdArrConst || newOpcode == Js::OpCodeAsmJs::StArrConst"
                        );
      if (!bVar2) goto LAB_004ba0ee;
      *puVar7 = 0;
      goto LAB_004b9e7d;
    }
    uVar3 = *(uint *)(Js::ArrayBufferView::ViewMask + (ulong)viewType * 4);
    srcRegSlot_00 = GetRegSlotFromIntReg(this,slotIndex);
    if ((0x603UL >> ((ulong)viewType & 0x3f) & 1) == 0) {
      pRVar4 = IR::RegOpnd::New(TyUint32,this->m_func);
      pRVar5 = BuildSrcOpnd(this,srcRegSlot_00,TyInt32);
      src2Opnd = IR::IntConstOpnd::New((ulong)uVar3,TyUint32,this->m_func,false);
      pIVar6 = IR::Instr::New(And_I4,&pRVar4->super_Opnd,&pRVar5->super_Opnd,&src2Opnd->super_Opnd,
                              this->m_func);
      AddInstr(this,pIVar6,offset);
    }
    else {
      pRVar4 = BuildSrcOpnd(this,srcRegSlot_00,TyInt32);
    }
    pRVar5 = BuildSrcOpnd(this,4,TyVar);
    dstOpnd = IR::IndirOpnd::New(pRVar5,pRVar4,local_38.type,this->m_func);
  }
  OVar8 = newOpcode & ~ExtendedOpcodePrefix;
  IR::Opnd::SetValueType(&dstOpnd->m_baseOpnd->super_Opnd,local_38.arrayType);
  if ((local_38.valueRegType & ~INT64) == FLOAT32) {
    bVar2 = IRType_IsFloat(local_38.type);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                         ,0x66b,"(IRType_IsFloat(typeInfo.type))","IRType_IsFloat(typeInfo.type)");
      if (!bVar2) {
LAB_004ba0ee:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar7 = 0;
    }
    if (OVar8 == LdArr) {
      this_00 = (IndirOpnd *)BuildDstOpnd(this,srcRegSlot,local_38.type);
    }
    else {
      this_00 = (IndirOpnd *)BuildSrcOpnd(this,srcRegSlot,local_38.type);
    }
    valueType.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         (anon_union_2_4_ea848c7b_for_ValueType_13)0x108;
  }
  else {
    bVar2 = IRType_IsNativeInt(local_38.type);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                         ,0x671,"(IRType_IsNativeInt(typeInfo.type))",
                         "IRType_IsNativeInt(typeInfo.type)");
      if (!bVar2) goto LAB_004ba0ee;
      *puVar7 = 0;
    }
    if (local_38.valueRegType != INT32) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                         ,0x672,"(typeInfo.valueRegType == WAsmJs::INT32)",
                         "typeInfo.valueRegType == WAsmJs::INT32");
      if (!bVar2) goto LAB_004ba0ee;
      *puVar7 = 0;
    }
    if (OVar8 == LdArr) {
      this_00 = (IndirOpnd *)BuildDstOpnd(this,srcRegSlot,TyInt32);
    }
    else {
      this_00 = (IndirOpnd *)BuildSrcOpnd(this,srcRegSlot,TyInt32);
    }
    valueType.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::GetInt(false);
  }
  IR::Opnd::SetValueType(&this_00->super_Opnd,(ValueType)valueType.field_0);
  if (OVar8 == LdArr) {
    opcode = LdArrViewElem;
    src1Opnd = dstOpnd;
    dstOpnd = this_00;
  }
  else {
    opcode = StArrViewElem;
    src1Opnd = this_00;
  }
  pIVar6 = IR::Instr::New(opcode,&dstOpnd->super_Opnd,&src1Opnd->super_Opnd,this->m_func);
  this_01 = Func::GetJITFunctionBody(this->m_func);
  bVar2 = JITTimeFunctionBody::UsesWAsmJsFastVirtualBuffer(this_01);
  if (!bVar2) {
    pRVar4 = BuildSrcOpnd(this,5,TyUint32);
    IR::Instr::SetSrc2(pIVar6,&pRVar4->super_Opnd);
  }
  AddInstr(this,pIVar6,offset);
  return;
}

Assistant:

void
IRBuilderAsmJs::BuildAsmTypedArr(Js::OpCodeAsmJs newOpcode, uint32 offset, uint32 slotIndex, Js::RegSlot value, Js::ArrayBufferView::ViewType viewType)
{
    bool isLd = newOpcode == Js::OpCodeAsmJs::LdArr || newOpcode == Js::OpCodeAsmJs::LdArrConst;
    Js::OpCode op = isLd ? Js::OpCode::LdArrViewElem : Js::OpCode::StArrViewElem;

    MemAccessTypeInfo typeInfo;
    InitializeMemAccessTypeInfo(viewType, &typeInfo);

    Js::RegSlot valueRegSlot = GetRegSlotFromTypedReg(value, typeInfo.valueRegType);
    IR::Instr * instr = nullptr;
    IR::Instr * maskInstr = nullptr;
    IR::RegOpnd * regOpnd = nullptr;
    IR::IndirOpnd * indirOpnd = nullptr;

    // Get the index
    if (newOpcode == Js::OpCodeAsmJs::LdArr || newOpcode == Js::OpCodeAsmJs::StArr)
    {
        uint32 mask = Js::ArrayBufferView::ViewMask[viewType];
        Js::RegSlot indexRegSlot = GetRegSlotFromIntReg(slotIndex);
        IR::RegOpnd * maskedOpnd = nullptr;
        if (mask != ~0)
        {
            maskedOpnd = IR::RegOpnd::New(TyUint32, m_func);
            maskInstr = IR::Instr::New(Js::OpCode::And_I4, maskedOpnd, BuildSrcOpnd(indexRegSlot, TyInt32), IR::IntConstOpnd::New(mask, TyUint32, m_func), m_func);
            AddInstr(maskInstr, offset);
        }
        else
        {
            maskedOpnd = BuildSrcOpnd(indexRegSlot, TyInt32);
        }
        indirOpnd = IR::IndirOpnd::New(BuildSrcOpnd(AsmJsRegSlots::BufferReg, TyVar), maskedOpnd, typeInfo.type, m_func);
        indirOpnd->GetBaseOpnd()->SetValueType(typeInfo.arrayType);
    }
    else
    {
        Assert(newOpcode == Js::OpCodeAsmJs::LdArrConst || newOpcode == Js::OpCodeAsmJs::StArrConst);
        indirOpnd = IR::IndirOpnd::New(BuildSrcOpnd(AsmJsRegSlots::BufferReg, TyVar), slotIndex, typeInfo.type, m_func);
        indirOpnd->GetBaseOpnd()->SetValueType(typeInfo.arrayType);
    }

    // Setup the value/destination
    if (typeInfo.valueRegType == WAsmJs::FLOAT32 || typeInfo.valueRegType == WAsmJs::FLOAT64)
    {
        Assert(IRType_IsFloat(typeInfo.type));
        regOpnd = !isLd ? BuildSrcOpnd(valueRegSlot, typeInfo.type) : BuildDstOpnd(valueRegSlot, typeInfo.type);
        regOpnd->SetValueType(ValueType::Float);
    }
    else
    {
        Assert(IRType_IsNativeInt(typeInfo.type));
        Assert(typeInfo.valueRegType == WAsmJs::INT32);
        regOpnd = !isLd ? BuildSrcOpnd(valueRegSlot, TyInt32) : BuildDstOpnd(valueRegSlot, TyInt32);
        regOpnd->SetValueType(ValueType::GetInt(false));
    }

    // Create the instruction
    if (isLd)
    {
        instr = IR::Instr::New(op, regOpnd, indirOpnd, m_func);
    }
    else
    {
        instr = IR::Instr::New(op, indirOpnd, regOpnd, m_func);
    }

    if (!m_func->GetJITFunctionBody()->UsesWAsmJsFastVirtualBuffer())
    {
        instr->SetSrc2(BuildSrcOpnd(AsmJsRegSlots::LengthReg, TyUint32));
    }
    AddInstr(instr, offset);
}